

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk.c
# Opt level: O0

void test_write_disk(void)

{
  archive_entry *paVar1;
  archive_entry *ae;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                  ,L'÷',L'\x12');
  paVar1 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'ú',(uint)(paVar1 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar1,"file");
  archive_entry_set_mode(paVar1,0x81ed);
  create_reg_file(paVar1,"Test creating a regular file");
  archive_entry_free(paVar1);
  paVar1 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'ā',(uint)(paVar1 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar1,"file2");
  archive_entry_set_mode(paVar1,0x81ed);
  create_reg_file2(paVar1,"Test creating another regular file");
  archive_entry_free(paVar1);
  paVar1 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'Ĉ',(uint)(paVar1 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar1,"file3");
  archive_entry_set_mode(paVar1,0x81ed);
  create_reg_file3(paVar1,"Regular file with size restriction");
  archive_entry_free(paVar1);
  paVar1 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'ď',(uint)(paVar1 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar1,"file3");
  archive_entry_set_mode(paVar1,0x81ed);
  create_reg_file4(paVar1,"Regular file with unspecified size");
  archive_entry_free(paVar1);
  paVar1 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'Ė',(uint)(paVar1 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar1,"file");
  archive_entry_set_mode(paVar1,0x81d4);
  create(paVar1,"Test creating a file over an existing file.");
  archive_entry_free(paVar1);
  paVar1 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'ĝ',(uint)(paVar1 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar1,"dir");
  archive_entry_set_mode(paVar1,0x416d);
  create(paVar1,"Test creating a regular dir.");
  archive_entry_free(paVar1);
  paVar1 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'Ĥ',(uint)(paVar1 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar1,"file");
  archive_entry_set_mode(paVar1,0x41e2);
  create(paVar1,"Test creating a dir over an existing file.");
  archive_entry_free(paVar1);
  paVar1 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'ī',(uint)(paVar1 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar1,"file");
  archive_entry_set_mode(paVar1,0x81e4);
  create(paVar1,"Test creating a file over an existing dir.");
  archive_entry_free(paVar1);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk)
{
	struct archive_entry *ae;
#if defined(_WIN32) && !defined(__CYGWIN__)
	wchar_t *fullpath;
	DWORD l;
#endif

	/* Force the umask to something predictable. */
	assertUmask(UMASK);

	/* A regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file(ae, "Test creating a regular file");
	archive_entry_free(ae);

	/* Another regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file2(ae, "Test creating another regular file");
	archive_entry_free(ae);

	/* A regular file with a size restriction */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file3");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file3(ae, "Regular file with size restriction");
	archive_entry_free(ae);

	/* A regular file with an unspecified size */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file3");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file4(ae, "Regular file with unspecified size");
	archive_entry_free(ae);

	/* A regular file over an existing file */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0724);
	create(ae, "Test creating a file over an existing file.");
	archive_entry_free(ae);

	/* A directory. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir");
	archive_entry_set_mode(ae, S_IFDIR | 0555);
	create(ae, "Test creating a regular dir.");
	archive_entry_free(ae);

	/* A directory over an existing file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFDIR | 0742);
	create(ae, "Test creating a dir over an existing file.");
	archive_entry_free(ae);

	/* A file over an existing dir. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0744);
	create(ae, "Test creating a file over an existing dir.");
	archive_entry_free(ae);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* A file with unusable characters in its file name. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname_w(ae, L"f:i*l?e\"f<i>l|e");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file_win(ae, "Test creating a regular file"
	    " with unusable characters in its file name");
	archive_entry_free(ae);

	/* A file with unusable characters in its directory name. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname_w(ae, L"d:i*r?e\"c<t>o|ry/file1");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file_win(ae, "Test creating a regular file"
	    " with unusable characters in its file name");
	archive_entry_free(ae);

	/* A full-path file with unusable characters in its file name. */
	assert((l = GetCurrentDirectoryW(0, NULL)) != 0);
	assert((fullpath = malloc((l + 20) * sizeof(wchar_t))) != NULL);
	assert((l = GetCurrentDirectoryW(l, fullpath)) != 0);
	wcscat(fullpath, L"\\f:i*l?e\"f<i>l|e");
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname_w(ae, fullpath);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file_win(ae, "Test creating a regular file"
	    " with unusable characters in its file name");
	archive_entry_free(ae);
	free(fullpath);

	/* A full-path file with unusable characters in its directory name. */
	assert((l = GetCurrentDirectoryW(0, NULL)) != 0);
	assert((fullpath = malloc((l + 30) * sizeof(wchar_t))) != NULL);
	assert((l = GetCurrentDirectoryW(l, fullpath)) != 0);
	wcscat(fullpath, L"\\d:i*r?e\"c<t>o|ry/file1");
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname_w(ae, fullpath);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file_win(ae, "Test creating a regular file"
	    " with unusable characters in its file name");
	archive_entry_free(ae);
	free(fullpath);
#endif /* _WIN32 && !__CYGWIN__ */
}